

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.h
# Opt level: O0

ZyanU64 ZyanAbsI64(ZyanI64 x)

{
  long local_20;
  ZyanI64 x_local;
  
  if (x == -0x8000000000000000) {
    x_local = -0x8000000000000000;
  }
  else {
    local_20 = x;
    if (x < 0) {
      local_20 = -x;
    }
    x_local = local_20;
  }
  return x_local;
}

Assistant:

ZYAN_INLINE ZyanU64 ZyanAbsI64(ZyanI64 x)
{
    // INT_MIN special case. Can't use the value directly because GCC thinks
    // it's too big for an INT64 literal, however is perfectly happy to accept
    // this expression. This is also hit INT64_MIN is defined in `stdint.h`.
    if (x == (-0x7fffffffffffffff - 1))
    {
        return 0x8000000000000000u;
    }

    return (ZyanU64)(x < 0 ? -x : x);
}